

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-context.c
# Opt level: O1

wchar_t context_menu_cave(chunk_conflict2 *c,wchar_t y,wchar_t x,wchar_t adjacent,wchar_t mx,
                         wchar_t my)

{
  player *ppVar1;
  uchar uVar2;
  _Bool _Var3;
  _Bool _Var4;
  cmd_code lookup_cmd;
  wchar_t wVar5;
  loc lVar6;
  object *obj;
  menu_conflict *m;
  char *label_list;
  square *psVar7;
  object *obj_00;
  ulong uVar8;
  command_conflict *pcVar9;
  loc finish;
  char *pcVar10;
  monster *pmVar11;
  monster_lore *lore;
  int value;
  char label;
  char *pcVar12;
  wchar_t mode;
  char m_name [80];
  char local_88 [88];
  
  _Var4 = (player->opts).opt[1];
  wVar5 = (wchar_t)_Var4;
  lVar6 = (loc)loc(x,y);
  obj = square_object((chunk_conflict *)c,lVar6);
  m = menu_dynamic_new();
  if (m == (menu_conflict *)0x0) {
    return L'\0';
  }
  label_list = string_make("abcdefghijklmnopqrstuvwxyz");
  m->selections = label_list;
  label = 'x';
  if (_Var4 == false) {
    label = 'l';
  }
  menu_dynamic_add_label(m,"Look At",label,0x45f,label_list);
  psVar7 = square((chunk_conflict *)c,lVar6);
  if (psVar7->mon != 0) {
    menu_dynamic_add_label(m,"Recall Info",'/',0x460,label_list);
  }
  mode = (wchar_t)_Var4;
  uVar2 = cmd_lookup_key_unktrl(CMD_USE,wVar5);
  menu_dynamic_add_label_valid(m,"Use Item On",uVar2,0x27,label_list,MN_ROW_VALID);
  _Var3 = player_can_cast(player,false);
  if (_Var3) {
    uVar2 = cmd_lookup_key_unktrl(CMD_CAST,mode);
    menu_dynamic_add_label_valid(m,"Cast On",uVar2,0x1e,label_list,MN_ROW_VALID);
  }
  if (adjacent == L'\0') {
    menu_dynamic_add_label(m,"Pathfind To",_Var4 * '\x02' + ',',0x15,label_list);
    uVar2 = cmd_lookup_key_unktrl(CMD_WALK,mode);
    menu_dynamic_add_label_valid(m,"Walk Towards",uVar2,0x13,label_list,MN_ROW_VALID);
    uVar2 = cmd_lookup_key_unktrl(CMD_RUN,mode);
    menu_dynamic_add_label_valid(m,"Run Towards",uVar2,0x32,label_list,MN_ROW_VALID);
  }
  else {
    obj_00 = chest_check(player,lVar6,CHEST_ANY);
    uVar2 = cmd_lookup_key_unktrl(CMD_ALTER,wVar5);
    psVar7 = square((chunk_conflict *)c,lVar6);
    pcVar12 = "Attack";
    if (psVar7->mon == 0) {
      pcVar12 = "Alter";
    }
    menu_dynamic_add_label_valid(m,pcVar12,uVar2,0x37,label_list,MN_ROW_VALID);
    if ((obj_00 != (object *)0x0) && (_Var4 = ignore_item_ok(player,obj_00), !_Var4)) {
      pcVar12 = "Open Chest";
      if (obj_00->known->pval != 0) {
        _Var4 = is_locked_chest(obj_00);
        if (_Var4) {
          uVar2 = cmd_lookup_key_unktrl(CMD_DISARM,wVar5);
          menu_dynamic_add_label_valid(m,"Disarm Chest",uVar2,0x2d,label_list,MN_ROW_VALID);
        }
        else {
          pcVar12 = "Open Disarmed Chest";
        }
      }
      uVar2 = cmd_lookup_key_unktrl(CMD_OPEN,wVar5);
      menu_dynamic_add_label_valid(m,pcVar12,uVar2,0x30,label_list,MN_ROW_VALID);
    }
    psVar7 = square((chunk_conflict *)c,lVar6);
    if ((0 < psVar7->mon) &&
       (_Var4 = flag_has_dbg((player->state).pflags,10,0x20,"player->state.pflags","(PF_STEAL)"),
       _Var4)) {
      uVar2 = cmd_lookup_key_unktrl(CMD_STEAL,wVar5);
      menu_dynamic_add_label_valid(m,"Steal",uVar2,0x38,label_list,MN_ROW_VALID);
    }
    _Var4 = square_isdisarmabletrap((chunk_conflict *)c,lVar6);
    if (_Var4) {
      uVar2 = cmd_lookup_key_unktrl(CMD_DISARM,wVar5);
      menu_dynamic_add_label_valid(m,"Disarm",uVar2,0x2d,label_list,MN_ROW_VALID);
      uVar2 = cmd_lookup_key_unktrl(CMD_JUMP,wVar5);
      menu_dynamic_add_label_valid(m,"Jump Onto",uVar2,0x14,label_list,MN_ROW_VALID);
    }
    _Var4 = square_isopendoor((chunk_conflict *)c,lVar6);
    if (_Var4) {
      uVar2 = cmd_lookup_key_unktrl(CMD_CLOSE,wVar5);
      pcVar12 = "Close";
      value = 0x31;
LAB_001d813f:
      menu_dynamic_add_label_valid(m,pcVar12,uVar2,value,label_list,MN_ROW_VALID);
    }
    else {
      _Var4 = square_iscloseddoor((chunk_conflict *)c,lVar6);
      if (_Var4) {
        uVar2 = cmd_lookup_key_unktrl(CMD_OPEN,wVar5);
        menu_dynamic_add_label_valid(m,"Open",uVar2,0x30,label_list,MN_ROW_VALID);
        uVar2 = cmd_lookup_key_unktrl(CMD_DISARM,wVar5);
        pcVar12 = "Lock";
        value = 0x2d;
        goto LAB_001d813f;
      }
      _Var4 = square_isdiggable((chunk_conflict *)c,lVar6);
      if (_Var4) {
        uVar2 = cmd_lookup_key_unktrl(CMD_TUNNEL,wVar5);
        pcVar12 = "Tunnel";
        value = 0x2f;
        goto LAB_001d813f;
      }
    }
    uVar2 = cmd_lookup_key_unktrl(CMD_WALK,wVar5);
    menu_dynamic_add_label_valid(m,"Walk Towards",uVar2,0x13,label_list,MN_ROW_VALID);
  }
  _Var4 = player_can_fire(player,false);
  if (_Var4) {
    uVar2 = cmd_lookup_key_unktrl(CMD_FIRE,wVar5);
    menu_dynamic_add_label_valid(m,"Fire On",uVar2,0x28,label_list,MN_ROW_VALID);
  }
  uVar2 = cmd_lookup_key_unktrl(CMD_THROW,wVar5);
  menu_dynamic_add_label_valid(m,"Throw To",uVar2,0x29,label_list,MN_ROW_VALID);
  msg_flag = false;
  screen_save();
  menu_dynamic_calc_location(m,mx,my);
  region_erase_bordered((region *)&m->boundary);
  if (player->timed[6] == 0) {
    psVar7 = square((chunk_conflict *)c,lVar6);
    if (psVar7->mon != 0) {
      pmVar11 = square_monster((chunk_conflict *)c,lVar6);
      monster_desc(local_88,0x50,pmVar11,L'\b');
      pcVar12 = format("(Enter to select command, ESC to cancel) You see %s:");
      goto LAB_001d827a;
    }
    if ((obj == (object *)0x0) || (_Var4 = ignore_item_ok(player,obj), _Var4)) {
      pcVar12 = square_apparent_name((chunk_conflict *)player->cave,lVar6);
      pcVar10 = square_apparent_look_prefix((chunk_conflict *)player->cave,lVar6);
      pcVar12 = format("(Enter to select command, ESC to cancel) You see %s%s:",pcVar10,pcVar12);
    }
    else {
      object_desc(local_88,0x50,obj,0x43,player);
      pcVar12 = format("(Enter to select command, ESC to cancel) You see %s:");
    }
    prt(pcVar12,L'\0',L'\0');
  }
  else {
    pcVar12 = "(Enter to select command, ESC to cancel) You see something strange:";
LAB_001d827a:
    prt(pcVar12,L'\0',L'\0');
  }
  lookup_cmd = menu_dynamic_select(m);
  menu_dynamic_free(m);
  string_free(label_list);
  screen_load();
  uVar2 = cmd_lookup_key(lookup_cmd,wVar5);
  uVar8 = (ulong)(lookup_cmd + CMD_LOADFILE);
  if (lookup_cmd + CMD_LOADFILE < 0x3a) {
    if ((0x30f470080300000U >> (uVar8 & 0x3f) & 1) != 0) {
      _Var4 = key_confirm_command(uVar2);
      if (!_Var4) {
        return L'\x01';
      }
      if (lookup_cmd < CMD_SLEEP) {
        uVar8 = (ulong)lookup_cmd;
        if ((0x187a00000180000U >> (uVar8 & 0x3f) & 1) != 0) {
          cmdq_push(lookup_cmd);
          pcVar9 = cmdq_peek();
          ppVar1 = player;
          finish = (loc)loc(x,y);
          lVar6.x = (ppVar1->grid).x;
          lVar6.y = (ppVar1->grid).y;
          wVar5 = motion_dir(lVar6,finish);
          cmd_set_arg_direction(pcVar9,"direction",wVar5);
          return L'\x01';
        }
        if ((0x38040000000U >> (uVar8 & 0x3f) & 1) != 0) {
          cmdq_push(lookup_cmd);
          pcVar9 = cmdq_peek();
          cmd_set_arg_target(pcVar9,"target",L'\x05');
          return L'\x01';
        }
        if (uVar8 == 0x15) goto LAB_001d8461;
      }
      if (lookup_cmd != 0x460) {
        if (lookup_cmd != 0x45f) {
          return L'\x01';
        }
        goto LAB_001d84a8;
      }
      goto LAB_001d84d2;
    }
    if (uVar8 == 0) {
      return L'\x03';
    }
    if (uVar8 == 0x16) {
LAB_001d8461:
      cmdq_push(CMD_PATHFIND);
      pcVar9 = cmdq_peek();
      lVar6 = (loc)loc(x,y);
      cmd_set_arg_point(pcVar9,"point",lVar6);
      return L'\x01';
    }
  }
  if (lookup_cmd == 0x45f) {
LAB_001d84a8:
    _Var4 = target_set_interactive(L'\x02',x,y);
    if (_Var4) {
      msg("Target Selected.");
      return L'\x01';
    }
    return L'\x01';
  }
  if (lookup_cmd != 0x460) {
    bell();
    return L'\x01';
  }
LAB_001d84d2:
  pmVar11 = square_monster((chunk_conflict *)c,lVar6);
  if (pmVar11 != (monster *)0x0) {
    lore = get_lore(pmVar11->race);
    lore_show_interactive(pmVar11->race,lore);
    return L'\x01';
  }
  return L'\x01';
}

Assistant:

int context_menu_cave(struct chunk *c, int y, int x, int adjacent, int mx,
					  int my)
{
	struct menu *m;
	int selected;
	char *labels;
	bool allowed = true;
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;
	unsigned char cmdkey;
	struct loc grid = loc(x, y);
	struct object *square_obj = square_object(c, grid);

	m = menu_dynamic_new();
	if (!m)
		return 0;

	labels = string_make(lower_case);
	m->selections = labels;

	/* Looking has different keys, but we don't have a way to look them up
	 * (see ui-game.c). */
	cmdkey = (mode == KEYMAP_MODE_ORIG) ? 'l' : 'x';
	menu_dynamic_add_label(m, "Look At", cmdkey, MENU_VALUE_LOOK, labels);

	if (square(c, grid)->mon)
		/* '/' is used for recall in both keymaps. */
		menu_dynamic_add_label(m, "Recall Info", '/', MENU_VALUE_RECALL,
							   labels);

	ADD_LABEL("Use Item On", CMD_USE, MN_ROW_VALID);

	if (player_can_cast(player, false))
		ADD_LABEL("Cast On", CMD_CAST, MN_ROW_VALID);

	if (adjacent) {
		struct object *obj = chest_check(player, grid, CHEST_ANY);
		ADD_LABEL((square(c, grid)->mon) ? "Attack" : "Alter", CMD_ALTER,
				  MN_ROW_VALID);

		if (obj && !ignore_item_ok(player, obj)) {
			if (obj->known->pval) {
				if (is_locked_chest(obj)) {
					ADD_LABEL("Disarm Chest", CMD_DISARM, MN_ROW_VALID);
					ADD_LABEL("Open Chest", CMD_OPEN, MN_ROW_VALID);
				} else {
					ADD_LABEL("Open Disarmed Chest", CMD_OPEN, MN_ROW_VALID);
				}
			} else {
				ADD_LABEL("Open Chest", CMD_OPEN, MN_ROW_VALID);
			}
		}

		if ((square(c, grid)->mon > 0) && player_has(player, PF_STEAL)) {
			ADD_LABEL("Steal", CMD_STEAL, MN_ROW_VALID);
		}

		if (square_isdisarmabletrap(c, grid)) {
			ADD_LABEL("Disarm", CMD_DISARM, MN_ROW_VALID);
			ADD_LABEL("Jump Onto", CMD_JUMP, MN_ROW_VALID);
		}

		if (square_isopendoor(c, grid)) {
			ADD_LABEL("Close", CMD_CLOSE, MN_ROW_VALID);
		}
		else if (square_iscloseddoor(c, grid)) {
			ADD_LABEL("Open", CMD_OPEN, MN_ROW_VALID);
			ADD_LABEL("Lock", CMD_DISARM, MN_ROW_VALID);
		}
		else if (square_isdiggable(c, grid)) {
			ADD_LABEL("Tunnel", CMD_TUNNEL, MN_ROW_VALID);
		}

		ADD_LABEL("Walk Towards", CMD_WALK, MN_ROW_VALID);
	} else {
		/* ',' is used for ignore in rogue keymap, so we'll just swap letters */
		cmdkey = (mode == KEYMAP_MODE_ORIG) ? ',' : '.';
		menu_dynamic_add_label(m, "Pathfind To", cmdkey, CMD_PATHFIND, labels);

		ADD_LABEL("Walk Towards", CMD_WALK, MN_ROW_VALID);
		ADD_LABEL("Run Towards", CMD_RUN, MN_ROW_VALID);
	}

	if (player_can_fire(player, false)) {
		ADD_LABEL("Fire On", CMD_FIRE, MN_ROW_VALID);
	}

	ADD_LABEL("Throw To", CMD_THROW, MN_ROW_VALID);

	/* Hack -- no flush needed */
	msg_flag = false;
	screen_save();

	menu_dynamic_calc_location(m, mx, my);
	region_erase_bordered(&m->boundary);

	if (player->timed[TMD_IMAGE]) {
		prt("(Enter to select command, ESC to cancel) You see something strange:", 0, 0);
	} else if (square(c, grid)->mon) {
		char m_name[80];
		struct monster *mon = square_monster(c, grid);

		/* Get the monster name ("a kobold") */
		monster_desc(m_name, sizeof(m_name), mon, MDESC_IND_VIS);

		prt(format("(Enter to select command, ESC to cancel) You see %s:",
				   m_name), 0, 0);
	} else if (square_obj && !ignore_item_ok(player, square_obj)) {
		char o_name[80];

		/* Obtain an object description */
		object_desc(o_name, sizeof (o_name), square_obj,
			ODESC_PREFIX | ODESC_FULL, player);

		prt(format("(Enter to select command, ESC to cancel) You see %s:",
				   o_name), 0, 0);
	} else {
		/* Feature (apply mimic) */
		const char *name = square_apparent_name(player->cave, grid);
		const char *prefix = square_apparent_look_prefix(player->cave, grid);

		prt(format("(Enter to select command, ESC to cancel) You see %s%s:", prefix, name), 0, 0);
	}

	selected = menu_dynamic_select(m);

	menu_dynamic_free(m);
	string_free(labels);

	screen_load();

	cmdkey = cmd_lookup_key(selected, mode);

	/* Check the command to see if it is allowed. */
	switch (selected) {
		case -1:
			/* User cancelled the menu. */
			return 3;

		case MENU_VALUE_LOOK:
		case MENU_VALUE_RECALL:
		case CMD_PATHFIND:
			allowed = true;
			break;

		case CMD_ALTER:
		case CMD_STEAL:
		case CMD_DISARM:
		case CMD_JUMP:
		case CMD_CLOSE:
		case CMD_OPEN:
		case CMD_TUNNEL:
		case CMD_WALK:
		case CMD_RUN:
		case CMD_CAST:
		case CMD_FIRE:
		case CMD_THROW:
		case CMD_USE:
			/* Only check for ^ inscriptions, since we don't have an object
			 * selected (if we need one). */
			allowed = key_confirm_command(cmdkey);
			break;

		default:
			/* Invalid command; prevent anything from happening. */
			bell();
			allowed = false;
			break;
	}

	if (!allowed)
		return 1;

	/* Perform the command. */
	switch (selected) {
		case MENU_VALUE_LOOK:
			/* Look at the spot */
			if (target_set_interactive(TARGET_LOOK, x, y)) {
				msg("Target Selected.");
			}
			break;

		case MENU_VALUE_RECALL: {
			/* Recall monster Info */
			struct monster *mon = square_monster(c, grid);
			if (mon) {
				struct monster_lore *lore = get_lore(mon->race);
				lore_show_interactive(mon->race, lore);
			}
		}
			break;

		case CMD_PATHFIND:
			cmdq_push(selected);
			cmd_set_arg_point(cmdq_peek(), "point", loc(x, y));
			break;

		case CMD_ALTER:
		case CMD_STEAL:
		case CMD_DISARM:
		case CMD_JUMP:
		case CMD_CLOSE:
		case CMD_OPEN:
		case CMD_TUNNEL:
		case CMD_WALK:
		case CMD_RUN:
			cmdq_push(selected);
			cmd_set_arg_direction(cmdq_peek(), "direction",
								  motion_dir(player->grid, loc(x, y)));
			break;

		case CMD_CAST:
		case CMD_FIRE:
		case CMD_THROW:
		case CMD_USE:
			cmdq_push(selected);
			cmd_set_arg_target(cmdq_peek(), "target", DIR_TARGET);
			break;

		default:
			break;
	}

	return 1;
}